

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O2

bool __thiscall Minisat::StringOption::hasDefaultValue(StringOption *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  char *pcVar1;
  __type _Var2;
  allocator local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __lhs = this->value;
  pcVar1 = this->defaultValue;
  _Var2 = __lhs == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0 &&
          pcVar1 == (char *)0x0;
  if (pcVar1 != (char *)0x0 &&
      __lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
    _Var2 = std::operator==(__lhs,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return _Var2;
}

Assistant:

virtual bool hasDefaultValue()
    {
        if (value == NULL) {
            return defaultValue == NULL;
        } else if (defaultValue == NULL) {
            return value == NULL;
        } else {
            return *value == std::string(defaultValue);
        }
    }